

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprandomrand48.cpp
# Opt level: O3

uint32_t __thiscall jrtplib::RTPRandomRand48::GetRandom32(RTPRandomRand48 *this)

{
  ulong uVar1;
  
  uVar1 = this->state * 0x5deece66d + 0xb;
  this->state = uVar1 & 0xffffffffffff;
  return (uint32_t)(uVar1 >> 0x10);
}

Assistant:

uint32_t RTPRandomRand48::GetRandom32()
{
#ifdef RTP_SUPPORT_THREAD
	mutex.Lock();
#endif // RTP_SUPPORT_THREAD

#ifdef RTP_HAVE_VSUINT64SUFFIX
	state = ((0x5DEECE66Dui64*state) + 0xBui64)&0x0000ffffffffffffui64;

	uint32_t x = (uint32_t)((state>>16)&0xffffffffui64);
#else
	state = ((0x5DEECE66DULL*state) + 0xBULL)&0x0000ffffffffffffULL;

	uint32_t x = (uint32_t)((state>>16)&0xffffffffULL);
#endif // RTP_HAVE_VSUINT64SUFFIX

#ifdef RTP_SUPPORT_THREAD
	mutex.Unlock();
#endif // RTP_SUPPORT_THREAD
	return x;
}